

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

bool __thiscall QPlainTextEdit::event(QPlainTextEdit *this,QEvent *e)

{
  QEvent QVar1;
  ushort uVar2;
  long lVar3;
  QPlainTextEditPrivate *this_00;
  QPlainTextEditControl *this_01;
  bool bVar4;
  GestureState GVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  QPalette *pal;
  QPanGesture *this_02;
  QScrollBar *this_03;
  QScrollBar *this_04;
  QPanGesture *panGesture;
  long in_FS_OFFSET;
  double dVar9;
  QRect QVar10;
  QPointF QVar11;
  QPoint local_88;
  QFontMetrics fm;
  QContextMenuEvent ce;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  uVar2 = *(ushort *)(e + 8);
  if (uVar2 - 0x18 < 2) {
    this_01 = this_00->control;
    pal = QWidget::palette((QWidget *)this);
    QWidgetTextControl::setPalette((QWidgetTextControl *)this_01,pal);
  }
  else {
    if (uVar2 != 0x33) {
      if (uVar2 == 0xc6) {
        this_02 = (QPanGesture *)QGestureEvent::gesture((QGestureEvent *)e,PanGesture);
        bVar4 = true;
        if (this_02 != (QPanGesture *)0x0) {
          this_03 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
          this_04 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
          GVar5 = QGesture::state((QGesture *)this_02);
          if (GVar5 == GestureStarted) {
            iVar6 = QAbstractSlider::value(&this_04->super_QAbstractSlider);
            this_00->originalOffsetY = iVar6;
          }
          QVar11 = QPanGesture::offset(this_02);
          dVar9 = QVar11.yp;
          if ((((QVar11.xp != 0.0) || (NAN(QVar11.xp))) || (dVar9 != 0.0)) || (NAN(dVar9))) {
            QGuiApplication::isRightToLeft();
            _fm = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
            document(this);
            QTextDocument::defaultFont();
            QFontMetrics::QFontMetrics(&fm,(QFont *)&ce);
            QFont::~QFont((QFont *)&ce);
            iVar7 = QFontMetrics::height();
            iVar8 = QAbstractSlider::value(&this_03->super_QAbstractSlider);
            QVar11 = QPanGesture::delta(this_02);
            iVar6 = this_00->originalOffsetY;
            QAbstractSlider::setValue
                      (&this_03->super_QAbstractSlider,(int)((double)iVar8 - QVar11.xp));
            QAbstractSlider::setValue
                      (&this_04->super_QAbstractSlider,(int)((double)iVar6 - dVar9 / (double)iVar7))
            ;
            QFontMetrics::~QFontMetrics(&fm);
          }
        }
      }
      else {
        if (uVar2 == 0x6e) goto LAB_00459e2d;
        if ((uVar2 != 0x52) || (e[0x38] != (QEvent)0x1)) goto LAB_00459e38;
        ensureCursorVisible(this);
        QVar10 = cursorRect(this);
        _fm = (QPoint)(((long)QVar10.x2.m_i.m_i + (long)QVar10.x1.m_i.m_i) / 2 & 0xffffffffU |
                      ((QVar10._8_8_ >> 0x20) + (QVar10._0_8_ >> 0x20)) / 2 << 0x20);
        _ce = &DAT_aaaaaaaaaaaaaaaa;
        local_88 = QWidget::mapToGlobal
                             ((this_00->super_QAbstractScrollAreaPrivate).viewport,(QPoint *)&fm);
        QContextMenuEvent::QContextMenuEvent(&ce,1,(QPoint *)&fm,&local_88,0);
        QVar1 = e[0xc];
        bVar4 = QAbstractScrollArea::event((QAbstractScrollArea *)this,(QEvent *)&ce);
        (**(code **)(*(long *)e + 0x10))(e,QVar1);
        QContextMenuEvent::~QContextMenuEvent(&ce);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
        return bVar4;
      }
      goto LAB_00459faf;
    }
LAB_00459e2d:
    QPlainTextEditPrivate::sendControlEvent(this_00,e);
  }
LAB_00459e38:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    bVar4 = QAbstractScrollArea::event((QAbstractScrollArea *)this,e);
    return bVar4;
  }
LAB_00459faf:
  __stack_chk_fail();
}

Assistant:

bool QPlainTextEdit::event(QEvent *e)
{
    Q_D(QPlainTextEdit);

    switch (e->type()) {
#ifndef QT_NO_CONTEXTMENU
    case QEvent::ContextMenu:
        if (static_cast<QContextMenuEvent *>(e)->reason() == QContextMenuEvent::Keyboard) {
            ensureCursorVisible();
            const QPoint cursorPos = cursorRect().center();
            QContextMenuEvent ce(QContextMenuEvent::Keyboard, cursorPos, d->viewport->mapToGlobal(cursorPos));
            ce.setAccepted(e->isAccepted());
            const bool result = QAbstractScrollArea::event(&ce);
            e->setAccepted(ce.isAccepted());
            return result;
        }
        break;
#endif // QT_NO_CONTEXTMENU
    case QEvent::ShortcutOverride:
    case QEvent::ToolTip:
        d->sendControlEvent(e);
        break;
#ifdef QT_KEYPAD_NAVIGATION
    case QEvent::EnterEditFocus:
    case QEvent::LeaveEditFocus:
        if (QApplicationPrivate::keypadNavigationEnabled())
            d->sendControlEvent(e);
        break;
#endif
#ifndef QT_NO_GESTURES
    case QEvent::Gesture:
        if (auto *g = static_cast<QGestureEvent *>(e)->gesture(Qt::PanGesture)) {
            QPanGesture *panGesture = static_cast<QPanGesture *>(g);
            QScrollBar *hBar = horizontalScrollBar();
            QScrollBar *vBar = verticalScrollBar();
            if (panGesture->state() == Qt::GestureStarted)
                d->originalOffsetY = vBar->value();
            QPointF offset = panGesture->offset();
            if (!offset.isNull()) {
                if (QGuiApplication::isRightToLeft())
                    offset.rx() *= -1;
                // QPlainTextEdit scrolls by lines only in vertical direction
                QFontMetrics fm(document()->defaultFont());
                int lineHeight = fm.height();
                int newX = hBar->value() - panGesture->delta().x();
                int newY = d->originalOffsetY - offset.y()/lineHeight;
                hBar->setValue(newX);
                vBar->setValue(newY);
            }
        }
        return true;
#endif // QT_NO_GESTURES
    case QEvent::WindowActivate:
    case QEvent::WindowDeactivate:
        d->control->setPalette(palette());
        break;
    default:
        break;
    }
    return QAbstractScrollArea::event(e);
}